

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  long lVar1;
  ImGuiTableColumn *p;
  ImGuiTableColumn *pIVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if ((table->LeftMostStretchedColumn == -1) || (table->RightMostStretchedColumn == -1)) {
    __assert_fail("table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x7f5,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  lVar1 = (long)table->ColumnsCount;
  if (0 < lVar1) {
    pIVar2 = (table->Columns).Data;
    fVar4 = 0.0;
    fVar5 = 0.0;
    lVar3 = lVar1;
    do {
      if ((table->Columns).DataEnd <= pIVar2) goto LAB_00191213;
      if ((pIVar2->IsEnabled == true) && ((pIVar2->Flags & 4) != 0)) {
        if (pIVar2->StretchWeight <= 0.0) {
          __assert_fail("column->StretchWeight > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                        ,0x7ff,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
        }
        fVar4 = fVar4 + pIVar2->StretchWeight;
        fVar5 = fVar5 + pIVar2->WidthRequest;
      }
      pIVar2 = pIVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if ((0.0 < fVar4) && (0.0 < fVar5)) {
      if (0 < table->ColumnsCount) {
        pIVar2 = (table->Columns).Data;
        do {
          if ((table->Columns).DataEnd <= pIVar2) {
LAB_00191213:
            __assert_fail("p >= Data && p < DataEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                          ,0x20c,
                          "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
          }
          if (((pIVar2->IsEnabled == true) && ((pIVar2->Flags & 4) != 0)) &&
             (fVar6 = (pIVar2->WidthRequest / fVar5) * fVar4, pIVar2->StretchWeight = fVar6,
             fVar6 <= 0.0)) {
            __assert_fail("column->StretchWeight > 0.0f",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                          ,0x80c,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
          }
          pIVar2 = pIVar2 + 1;
          lVar1 = lVar1 + -1;
        } while (lVar1 != 0);
      }
      return;
    }
  }
  __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                ,0x803,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}